

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O3

void readlargeobjects(uint32 numlargeobjects,uint32 numsmallobjects,uint8 **ptr,uint32 *len,
                     MOJOSHADER_effect *effect,char *profile,MOJOSHADER_swizzle *swiz,uint swizcount
                     ,MOJOSHADER_samplerMap *smap,uint smapcount,MOJOSHADER_malloc m,
                     MOJOSHADER_free f,void *d)

{
  MOJOSHADER_effectObject *pMVar1;
  MOJOSHADER_symbolType MVar2;
  uint *puVar3;
  MOJOSHADER_effectParam *pMVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  void *pvVar9;
  MOJOSHADER_parseData *pMVar10;
  MOJOSHADER_preshader *pMVar11;
  uint32 uVar12;
  long lVar13;
  uint uVar14;
  size_t __n;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  MOJOSHADER_effectState *pMVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  char *local_78;
  char mainfn [32];
  
  if (numlargeobjects != 0) {
    iVar6 = numsmallobjects + numlargeobjects + 1;
    iVar15 = numsmallobjects + 1;
    if (iVar15 < iVar6) {
      uVar14 = *len;
      do {
        uVar16 = 0;
        uVar7 = 0;
        uVar19 = 0;
        uVar17 = 0;
        uVar12 = 0;
        __n = 0;
        if (3 < uVar14) {
          puVar3 = (uint *)*ptr;
          uVar7 = *puVar3;
          *ptr = (uint8 *)(puVar3 + 1);
          *len = uVar14 - 4;
          if (uVar14 - 4 < 4) {
            uVar19 = 0;
LAB_0012797c:
            uVar16 = 0;
            uVar17 = 0;
          }
          else {
            uVar19 = puVar3[1];
            *ptr = (uint8 *)(puVar3 + 2);
            if ((uVar14 & 0xfffffffc) == 8) goto LAB_0012797c;
            *ptr = (uint8 *)(puVar3 + 3);
            *len = uVar14 - 0xc;
            if (uVar14 - 0xc < 4) goto LAB_0012797c;
            uVar17 = (ulong)puVar3[3];
            *ptr = (uint8 *)(puVar3 + 4);
            *len = uVar14 - 0x10;
            if (uVar14 - 0x10 < 4) {
              uVar16 = 0;
            }
            else {
              uVar16 = puVar3[4];
              *ptr = (uint8 *)(puVar3 + 5);
              *len = uVar14 - 0x14;
              if (3 < uVar14 - 0x14) {
                __n = (size_t)puVar3[5];
                *ptr = (uint8 *)(puVar3 + 6);
                uVar12 = uVar14 - 0x18;
                goto LAB_00127983;
              }
            }
          }
          uVar12 = 0;
          __n = 0;
        }
LAB_00127983:
        *len = uVar12;
        if (uVar7 == 0xffffffff) {
          pMVar18 = (MOJOSHADER_effectState *)effect->params[uVar19].value.field_4.values;
        }
        else {
          pMVar18 = effect->techniques[uVar7].passes[uVar19].states;
        }
        pMVar1 = effect->objects + *pMVar18[uVar17].value.field_4.valuesZBT;
        MVar2 = pMVar1->type;
        uVar14 = (uint)__n;
        if (MVar2 - MOJOSHADER_SYMTYPE_SAMPLER < 5) {
          if (uVar14 != 0) {
            pvVar9 = (*m)(uVar14,d);
            memcpy(pvVar9,*ptr,__n);
            *(void **)((long)pMVar1 + 8) = pvVar9;
          }
        }
        else if (MVar2 - MOJOSHADER_SYMTYPE_PIXELSHADER < 2) {
          *(uint *)((long)pMVar1 + 4) = uVar7;
          *(uint *)((long)pMVar1 + 8) = uVar19;
          if (uVar16 == 2) {
            *(int *)((long)pMVar1 + 0xc) = 1;
            puVar3 = (uint *)*ptr;
            uVar7 = *puVar3;
            if ((ulong)uVar7 == 0) {
              local_78 = (char *)0x0;
            }
            else {
              local_78 = (char *)(*m)(uVar7,d);
              memcpy(local_78,puVar3 + 1,(ulong)uVar7);
            }
            *(int *)((long)pMVar1 + 0x20) = 1;
            pvVar9 = (*m)(4,d);
            *(void **)((long)pMVar1 + 0x28) = pvVar9;
            iVar8 = findparameter(effect->params,effect->param_count,local_78);
            **(int **)((long)pMVar1 + 0x28) = iVar8;
            (*f)(local_78,d);
            pMVar11 = MOJOSHADER_parsePreshader(*ptr + (uVar7 + 4),uVar14 - 0x10,m,f,d);
            *(MOJOSHADER_preshader **)((long)pMVar1 + 0x40) = pMVar11;
            uVar7 = pMVar11->symbol_count;
            *(uint *)((long)pMVar1 + 0x10) = uVar7;
            pvVar9 = (*m)(uVar7 << 2,d);
            *(void **)((long)pMVar1 + 0x18) = pvVar9;
            lVar13 = *(long *)((long)pMVar1 + 0x40);
            if (*(int *)(lVar13 + 0x14) != 0) {
              lVar21 = 0;
              uVar17 = 0;
              do {
                iVar8 = findparameter(effect->params,effect->param_count,
                                      *(char **)(*(long *)(lVar13 + 0x18) + lVar21));
                *(int *)(*(long *)((long)pMVar1 + 0x18) + uVar17 * 4) = iVar8;
                uVar17 = uVar17 + 1;
                lVar13 = *(long *)((long)pMVar1 + 0x40);
                lVar21 = lVar21 + 0x38;
              } while (uVar17 < *(uint *)(lVar13 + 0x14));
            }
          }
          else {
            snprintf(mainfn,0x20,"ShaderFunction%u");
            pMVar10 = MOJOSHADER_parse(profile,mainfn,*ptr,uVar14,swiz,swizcount,smap,smapcount,m,f,
                                       d);
            *(MOJOSHADER_parseData **)((long)pMVar1 + 0x40) = pMVar10;
            iVar8 = pMVar10->symbol_count;
            if (0 < iVar8) {
              lVar13 = 8;
              lVar21 = 0;
              do {
                if (*(int *)((long)&pMVar10->symbols->name + lVar13) == 3) {
                  *(int *)((long)pMVar1 + 0x30) = *(int *)((long)pMVar1 + 0x30) + 1;
                  iVar8 = pMVar10->symbol_count;
                }
                lVar21 = lVar21 + 1;
                lVar13 = lVar13 + 0x38;
              } while (lVar21 < iVar8);
            }
            *(int *)((long)pMVar1 + 0x20) = iVar8;
            pvVar9 = (*m)(iVar8 << 2,d);
            *(void **)((long)pMVar1 + 0x28) = pvVar9;
            pvVar9 = (*m)(*(int *)((long)pMVar1 + 0x30) * 0x18,d);
            *(void **)((long)pMVar1 + 0x38) = pvVar9;
            lVar13 = *(long *)((long)pMVar1 + 0x40);
            if (0 < *(int *)(lVar13 + 0xa0)) {
              lVar20 = 0;
              lVar21 = 0;
              uVar17 = 0;
              do {
                iVar8 = findparameter(effect->params,effect->param_count,
                                      *(char **)(*(long *)(lVar13 + 0xa8) + lVar20));
                *(int *)(*(long *)((long)pMVar1 + 0x28) + lVar21 * 4) = iVar8;
                lVar13 = *(long *)((long)pMVar1 + 0x40);
                if (*(int *)(*(long *)(lVar13 + 0xa8) + 8 + lVar20) == 3) {
                  lVar5 = uVar17 * 0x18;
                  *(undefined8 *)(*(long *)((long)pMVar1 + 0x38) + lVar5) =
                       *(undefined8 *)(*(long *)(lVar13 + 0xa8) + lVar20);
                  *(undefined4 *)(*(long *)((long)pMVar1 + 0x38) + 8 + lVar5) =
                       *(undefined4 *)
                        (*(long *)(*(long *)((long)pMVar1 + 0x40) + 0xa8) + 0xc + lVar20);
                  pMVar4 = effect->params;
                  *(uint *)(*(long *)((long)pMVar1 + 0x38) + 0xc + lVar5) =
                       pMVar4[iVar8].value.value_count;
                  *(anon_union_8_20_d40dc30a_for_MOJOSHADER_effectValue_4 *)
                   (*(long *)((long)pMVar1 + 0x38) + 0x10 + lVar5) = pMVar4[iVar8].value.field_4;
                  uVar17 = (ulong)((int)uVar17 + 1);
                  lVar13 = *(long *)((long)pMVar1 + 0x40);
                }
                lVar21 = lVar21 + 1;
                lVar20 = lVar20 + 0x38;
              } while (lVar21 < *(int *)(lVar13 + 0xa0));
            }
            if (*(long *)(lVar13 + 0xb0) != 0) {
              iVar8 = *(int *)(*(long *)(lVar13 + 0xb0) + 0x14);
              *(int *)((long)pMVar1 + 0x10) = iVar8;
              pvVar9 = (*m)(iVar8 << 2,d);
              *(void **)((long)pMVar1 + 0x18) = pvVar9;
              lVar13 = *(long *)(*(long *)((long)pMVar1 + 0x40) + 0xb0);
              if (*(int *)(lVar13 + 0x14) != 0) {
                lVar21 = 0;
                uVar17 = 0;
                do {
                  iVar8 = findparameter(effect->params,effect->param_count,
                                        *(char **)(*(long *)(lVar13 + 0x18) + lVar21));
                  *(int *)(*(long *)((long)pMVar1 + 0x18) + uVar17 * 4) = iVar8;
                  uVar17 = uVar17 + 1;
                  lVar13 = *(long *)(*(long *)((long)pMVar1 + 0x40) + 0xb0);
                  lVar21 = lVar21 + 0x38;
                } while (uVar17 < *(uint *)(lVar13 + 0x14));
              }
            }
          }
        }
        else if (MVar2 != MOJOSHADER_SYMTYPE_VOID) {
          __assert_fail("0 && \"Large object type unknown!\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                        ,0x33a,
                        "void readlargeobjects(const uint32, const uint32, const uint8 **, uint32 *, MOJOSHADER_effect *, const char *, const MOJOSHADER_swizzle *, const unsigned int, const MOJOSHADER_samplerMap *, const unsigned int, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                       );
        }
        uVar14 = uVar14 + 3 & 0xfffffffc;
        *ptr = *ptr + uVar14;
        uVar14 = *len - uVar14;
        *len = uVar14;
        iVar15 = iVar15 + 1;
      } while (iVar15 != iVar6);
    }
  }
  return;
}

Assistant:

static void readlargeobjects(const uint32 numlargeobjects,
                             const uint32 numsmallobjects,
                             const uint8 **ptr,
                             uint32 *len,
                             MOJOSHADER_effect *effect,
                             const char *profile,
                             const MOJOSHADER_swizzle *swiz,
                             const unsigned int swizcount,
                             const MOJOSHADER_samplerMap *smap,
                             const unsigned int smapcount,
                             MOJOSHADER_malloc m,
                             MOJOSHADER_free f,
                             void *d)
{
    int i, j;
    if (numlargeobjects == 0) return;

    int numobjects = numsmallobjects + numlargeobjects + 1;
    for (i = numsmallobjects + 1; i < numobjects; i++)
    {
        const uint32 technique = readui32(ptr, len);
        const uint32 index = readui32(ptr, len);
        /*const uint32 FIXME =*/ readui32(ptr, len);
        const uint32 state = readui32(ptr, len);
        const uint32 type = readui32(ptr, len);
        const uint32 length = readui32(ptr, len);

        uint32 objectIndex;
        if (technique == -1)
            objectIndex = effect->params[index].value.valuesSS[state].value.valuesI[0];
        else
            objectIndex = effect->techniques[technique].passes[index].states[state].value.valuesI[0];

        MOJOSHADER_effectObject *object = &effect->objects[objectIndex];
        if (object->type == MOJOSHADER_SYMTYPE_PIXELSHADER
         || object->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            object->shader.technique = technique;
            object->shader.pass = index;

            const char *emitter = profile;
            if (type == 2)
            {
                /* This is a standalone preshader!
                 * It exists solely for effect passes that do not use a single
                 * vertex/fragment shader.
                 */
                object->shader.is_preshader = 1;
                const uint32 start = *((uint32 *) *ptr) + 4;
                const uint32 end = 16; // FIXME: Why? -flibit
                const char *array = readstring(*ptr, 0, m, d);
                object->shader.param_count = 1;
                object->shader.params = (uint32 *) m(sizeof (uint32), d);
                object->shader.params[0] = findparameter(effect->params,
                                                         effect->param_count,
                                                         array);
                f((void *) array, d);
                object->shader.preshader = MOJOSHADER_parsePreshader(*ptr + start, length - end,
                                                                     m, f, d);
                // !!! FIXME: check for errors.
                object->shader.preshader_param_count = object->shader.preshader->symbol_count;
                object->shader.preshader_params = (uint32 *) m(object->shader.preshader_param_count * sizeof (uint32), d);
                for (j = 0; j < object->shader.preshader->symbol_count; j++)
                {
                    object->shader.preshader_params[j] = findparameter(effect->params,
                                                                       effect->param_count,
                                                                       object->shader.preshader->symbols[j].name);
                } // for
            } // if
            else
            {
                char mainfn[32];
                snprintf(mainfn, sizeof (mainfn), "ShaderFunction%u", (unsigned int) objectIndex);
                object->shader.shader = MOJOSHADER_parse(emitter, mainfn, *ptr, length,
                                                         swiz, swizcount, smap, smapcount,
                                                         m, f, d);
                // !!! FIXME: check for errors.
                for (j = 0; j < object->shader.shader->symbol_count; j++)
                    if (object->shader.shader->symbols[j].register_set == MOJOSHADER_SYMREGSET_SAMPLER)
                        object->shader.sampler_count++;
                object->shader.param_count = object->shader.shader->symbol_count;
                object->shader.params = (uint32 *) m(object->shader.param_count * sizeof (uint32), d);
                object->shader.samplers = (MOJOSHADER_samplerStateRegister *) m(object->shader.sampler_count * sizeof (MOJOSHADER_samplerStateRegister), d);
                uint32 curSampler = 0;
                for (j = 0; j < object->shader.shader->symbol_count; j++)
                {
                    int par = findparameter(effect->params,
                                            effect->param_count,
                                            object->shader.shader->symbols[j].name);
                    object->shader.params[j] = par;
                    if (object->shader.shader->symbols[j].register_set == MOJOSHADER_SYMREGSET_SAMPLER)
                    {
                        object->shader.samplers[curSampler].sampler_name = object->shader.shader->symbols[j].name;
                        object->shader.samplers[curSampler].sampler_register = object->shader.shader->symbols[j].register_index;
                        object->shader.samplers[curSampler].sampler_state_count = effect->params[par].value.value_count;
                        object->shader.samplers[curSampler].sampler_states = effect->params[par].value.valuesSS;
                        curSampler++;
                    } // if
                } // for
                if (object->shader.shader->preshader)
                {
                    object->shader.preshader_param_count = object->shader.shader->preshader->symbol_count;
                    object->shader.preshader_params = (uint32 *) m(object->shader.preshader_param_count * sizeof (uint32), d);
                    for (j = 0; j < object->shader.shader->preshader->symbol_count; j++)
                    {
                        object->shader.preshader_params[j] = findparameter(effect->params,
                                                                           effect->param_count,
                                                                           object->shader.shader->preshader->symbols[j].name);
                    } // for
                } // if
            }
        } // if
        else if (object->type == MOJOSHADER_SYMTYPE_SAMPLER
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER1D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER2D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER3D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        {
            if (length > 0)
            {
                char *str = (char *) m(length, d);
                memcpy(str, *ptr, length);
                object->mapping.name = str;
            } // if
        } // else if
        else if (object->type != MOJOSHADER_SYMTYPE_VOID) // FIXME: Why? -flibit
        {
            assert(0 && "Large object type unknown!");
        } // else

        /* Object block is always a multiple of four */
        const uint32 blocklen = (length + 3) - ((length - 1) % 4);
        *ptr += blocklen;
        *len -= blocklen;
    } // for
}